

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O1

void ga_f2cstring(char *fstring,int flength,char *cstring,int clength)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = flength + 1;
  lVar3 = (long)flength;
  do {
    if (lVar3 == 0) {
      iVar2 = 0;
      break;
    }
    iVar2 = iVar2 + -1;
    lVar1 = lVar3 + -1;
    lVar3 = lVar3 + -1;
  } while (fstring[lVar1] == ' ');
  iVar4 = clength + -1;
  if (iVar2 < clength) {
    iVar4 = iVar2;
  }
  lVar3 = (long)iVar4;
  cstring[lVar3] = '\0';
  if (iVar4 != 0) {
    do {
      cstring[lVar3 + -1] = fstring[lVar3 + -1];
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void ga_f2cstring(char *fstring, int flength, char *cstring, int clength)
{
    /* remove trailing blanks from fstring */
    while (flength-- && fstring[flength] == ' ') ;

    /* the postdecrement above went one too far */
    flength++;

    /* truncate fstring to cstring size */
    if (flength >= clength) {
        flength = clength - 1;
    }

    /* ensure that cstring is NUL-terminated */
    cstring[flength] = '\0';

    /* copy fstring to cstring */
    while (flength--) {
        cstring[flength] = fstring[flength];
    }
}